

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O2

MDD lddmc_sat_one_mdd(MDD mdd)

{
  uint8_t *puVar1;
  MDD MVar2;
  
  if (mdd < 2) {
    return mdd;
  }
  puVar1 = nodes->data;
  MVar2 = lddmc_sat_one_mdd(*(ulong *)(puVar1 + mdd * 0x10 + 8) >> 0x11);
  MVar2 = lddmc_makenode(*(uint32_t *)(puVar1 + mdd * 0x10 + 6),MVar2,0);
  return MVar2;
}

Assistant:

MDD
lddmc_sat_one_mdd(MDD mdd)
{
    if (mdd == lddmc_false) return lddmc_false;
    if (mdd == lddmc_true) return lddmc_true;
    mddnode_t n = LDD_GETNODE(mdd);
    MDD down = lddmc_sat_one_mdd(mddnode_getdown(n));
    return lddmc_makenode(mddnode_getvalue(n), down, lddmc_false);
}